

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *os;
  AssertionResult *pAVar2;
  pointer pcVar3;
  IColourImpl *pIVar4;
  Colour colourGuard;
  Colour local_41;
  SourceLineInfo local_40;
  
  local_41.m_moved = false;
  pIVar4 = Colour::impl();
  (**(code **)(*(long *)pIVar4 + 0x10))(pIVar4,0x17);
  os = this->stream;
  pAVar2 = this->result;
  paVar1 = &local_40.file.field_2;
  pcVar3 = (pAVar2->m_info).lineInfo.file._M_dataplus._M_p;
  local_40.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + (pAVar2->m_info).lineInfo.file._M_string_length);
  local_40.line = (pAVar2->m_info).lineInfo.line;
  operator<<(os,&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(os,": ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.file._M_dataplus._M_p);
  }
  Colour::~Colour(&local_41);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ": ";
            }